

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  Option<Catch::SectionTracking::TestCaseTracker> *this_00;
  Counts *pCVar1;
  size_t *psVar2;
  IStreamingReporter *pIVar3;
  size_t sVar4;
  int iVar5;
  IMutableContext *pIVar6;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  TestCaseInfo testInfo;
  string local_2c8;
  string local_2a8;
  Totals local_288;
  TestCaseInfo local_260;
  undefined1 local_180 [48];
  undefined1 local_150 [24];
  _Alloc_hider local_138;
  size_t local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_128;
  bool local_118;
  
  local_288.assertions.passed = (this->m_totals).assertions.passed;
  local_288.assertions.failed = (this->m_totals).assertions.failed;
  local_288.testCases.passed = (this->m_totals).testCases.passed;
  local_288.testCases.failed = (this->m_totals).testCases.failed;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_local_buf[0] = '\0';
  TestCaseInfo::TestCaseInfo(&local_260,&testCase->super_TestCaseInfo);
  pIVar3 = (this->m_reporter).m_p;
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar3,&local_260);
  this->m_activeTestCase = testCase;
  local_180._0_8_ = local_180 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_180,local_260.name._M_dataplus._M_p,
             local_260.name._M_dataplus._M_p + local_260.name._M_string_length);
  local_150._16_8_ = local_150;
  local_180._32_4_ = NotStarted;
  local_150._0_4_ = _S_red;
  local_150._8_8_ = (_Base_ptr)0x0;
  local_130 = 0;
  aStack_128._M_allocated_capacity = 0;
  local_118 = false;
  this_00 = &this->m_testCaseTracker;
  local_138._M_p = (pointer)local_150._16_8_;
  aStack_128._8_8_ = (TestCaseTracker *)local_180;
  Option<Catch::SectionTracking::TestCaseTracker>::operator=(this_00,(TestCaseTracker *)local_180);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
               *)(local_180 + 0x28));
  if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
    operator_delete((void *)local_180._0_8_);
  }
LAB_00140017:
  do {
    runCurrentTest(this,&local_2a8,&local_2c8);
    if ((this_00->nullableValue->m_testCase).m_runState != Completed) {
      sVar4 = (this->m_totals).assertions.failed;
      iVar5 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
      if (sVar4 != (long)iVar5) goto LAB_00140017;
    }
    pIVar6 = getCurrentMutableContext();
    iVar5 = (*(pIVar6->super_IContext)._vptr_IContext[5])(pIVar6);
    if ((char)iVar5 == '\0') goto LAB_00140076;
    sVar4 = (this->m_totals).assertions.failed;
    iVar5 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
    if (sVar4 == (long)iVar5) {
LAB_00140076:
      Totals::delta(__return_storage_ptr__,&this->m_totals,&local_288);
      pCVar1 = &(this->m_totals).testCases;
      pCVar1->passed = pCVar1->passed + (__return_storage_ptr__->testCases).passed;
      psVar2 = &(this->m_totals).testCases.failed;
      *psVar2 = *psVar2 + (__return_storage_ptr__->testCases).failed;
      pIVar3 = (this->m_reporter).m_p;
      sVar4 = (this->m_totals).assertions.failed;
      iVar5 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
      TestCaseStats::TestCaseStats
                ((TestCaseStats *)local_180,&local_260,__return_storage_ptr__,&local_2a8,&local_2c8,
                 sVar4 == (long)iVar5);
      (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar3,local_180);
      TestCaseStats::~TestCaseStats((TestCaseStats *)local_180);
      this->m_activeTestCase = (TestCase *)0x0;
      Option<Catch::SectionTracking::TestCaseTracker>::reset(this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.lineInfo.file._M_dataplus._M_p != &local_260.lineInfo.file.field_2) {
        operator_delete(local_260.lineInfo.file._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.tagsAsString._M_dataplus._M_p != &local_260.tagsAsString.field_2) {
        operator_delete(local_260.tagsAsString._M_dataplus._M_p);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_260.tags._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.description._M_dataplus._M_p != &local_260.description.field_2) {
        operator_delete(local_260.description._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.className._M_dataplus._M_p != &local_260.className.field_2) {
        operator_delete(local_260.className._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.name._M_dataplus._M_p != &local_260.name.field_2) {
        operator_delete(local_260.name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;
            m_testCaseTracker = TestCaseTracker( testInfo.name );

            do {
                do {
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isCompleted() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = NULL;
            m_testCaseTracker.reset();

            return deltaTotals;
        }